

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O3

void __thiscall
ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>
          (ThreadedReplayer *this,
          vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>
          *deferred,
          unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          *pipelines,
          unordered_map<unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo>_>_>
          *parents,vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *work,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes,uint start_index)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  unordered_map<unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo>_>_>
  *puVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  ulong uVar13;
  int iVar14;
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *pvVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_3;
  EnqueuedWork local_c8;
  ThreadedReplayer *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  int local_8c;
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *local_88;
  unordered_map<unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo>_>_>
  *local_80;
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  *local_78;
  vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>
  *local_70;
  int local_64;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  ulong local_58;
  ulong local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_48;
  ulong local_40;
  ulong local_38;
  
  local_a0 = this;
  local_80 = parents;
  local_78 = pipelines;
  local_70 = deferred;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
  p_Var4->_M_use_count = 1;
  p_Var4->_M_weak_count = 1;
  p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002ac670;
  p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var4[1]._vptr__Sp_counted_base = (_func_int **)(p_Var4 + 4);
  p_Var4[1]._M_use_count = 1;
  p_Var4[1]._M_weak_count = 0;
  p_Var4[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var4[2]._M_use_count = 0;
  p_Var4[2]._M_weak_count = 0;
  *(undefined4 *)&p_Var4[3]._vptr__Sp_counted_base = 0x3f800000;
  p_Var4[3]._M_use_count = 0;
  p_Var4[3]._M_weak_count = 0;
  p_Var4[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  lVar10 = (long)(hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar10 == 0) {
    iVar3 = 0;
    uVar7 = 0;
  }
  else {
    local_60 = p_Var4 + 1;
    uVar11 = lVar10 >> 3;
    local_50 = (ulong)start_index << 0x20;
    iVar3 = 0;
    uVar5 = 0x400;
    uVar6 = 0;
    uVar7 = 0;
    uVar13 = 0;
    local_98 = p_Var4;
    local_88 = work;
    local_48 = hashes;
    do {
      pvVar2 = local_48;
      iVar14 = (int)uVar5 + -0x400;
      uVar9 = (int)uVar11 + iVar3;
      if (0x3ff < uVar9) {
        uVar9 = 0x400;
      }
      local_64 = iVar3;
      local_40 = uVar6;
      local_38 = uVar5;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
      p_Var4->_M_use_count = 1;
      p_Var4->_M_weak_count = 1;
      p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002ac6e8;
      p_Var4[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var4[1]._M_use_count = 0;
      p_Var4[1]._M_weak_count = 0;
      p_Var4[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      iVar3 = (int)(uVar13 >> 1) * 0xe;
      local_c8.order_index = iVar3 + uVar7;
      local_c8.func.super__Function_base._M_functor._8_8_ = 0;
      local_58 = uVar13;
      local_c8.func.super__Function_base._M_functor._M_unused._M_object = operator_new(0x28);
      pvVar15 = local_88;
      (((ThreadedReplayer *)local_c8.func.super__Function_base._M_functor._M_unused._0_8_)->
      super_StateCreatorInterface)._vptr_StateCreatorInterface = (_func_int **)local_a0;
      *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)
       &((ThreadedReplayer *)local_c8.func.super__Function_base._M_functor._M_unused._0_8_)->opts =
           pvVar2;
      (((ThreadedReplayer *)local_c8.func.super__Function_base._M_functor._M_unused._0_8_)->opts).
      on_disk_pipeline_cache_path._M_dataplus._M_p = (pointer)local_70;
      *(uint *)&(((ThreadedReplayer *)local_c8.func.super__Function_base._M_functor._M_unused._0_8_)
                ->opts).on_disk_pipeline_cache_path._M_string_length = uVar7;
      *(uint *)((long)&(((ThreadedReplayer *)
                        local_c8.func.super__Function_base._M_functor._M_unused._0_8_)->opts).
                       on_disk_pipeline_cache_path._M_string_length + 4) = uVar9;
      *(int *)&(((ThreadedReplayer *)local_c8.func.super__Function_base._M_functor._M_unused._0_8_)
               ->opts).on_disk_pipeline_cache_path.field_2 = iVar14;
      local_c8.func._M_invoker =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:2667:21)>
           ::_M_invoke;
      local_c8.func.super__Function_base._M_manager =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:2667:21)>
           ::_M_manager;
      local_8c = iVar14;
      std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::emplace_back<EnqueuedWork>
                (local_88,&local_c8);
      if (local_c8.func.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_c8.func.super__Function_base._M_manager)
                  ((_Any_data *)&local_c8.func,(_Any_data *)&local_c8.func,__destroy_functor);
      }
      puVar8 = local_80;
      if (uVar7 == 0) {
        local_c8.order_index = iVar3 + 2;
        local_c8.func.super__Function_base._M_functor._M_unused._M_object = local_a0;
        local_c8.func.super__Function_base._M_functor._8_8_ = local_80;
        local_c8.func._M_invoker =
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:2745:22)>
             ::_M_invoke;
        local_c8.func.super__Function_base._M_manager =
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:2745:22)>
             ::_M_manager;
        std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::emplace_back<EnqueuedWork>
                  (pvVar15,&local_c8);
        if (local_c8.func.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_c8.func.super__Function_base._M_manager)
                    ((_Any_data *)&local_c8.func,(_Any_data *)&local_c8.func,__destroy_functor);
        }
      }
      local_c8.order_index = uVar7 + iVar3 + 4;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
      p_Var12 = p_Var4 + 1;
      local_c8.func.super__Function_base._M_functor._8_8_ = 0;
      local_c8.func.super__Function_base._M_functor._M_unused._M_object = operator_new(0x28);
      *(ThreadedReplayer **)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ = local_a0
      ;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 8) = p_Var12;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = p_Var4;
      *(vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>
        **)((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x18) = local_70;
      *(uint *)((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x20) = uVar7;
      local_c8.func._M_invoker =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:2784:21)>
           ::_M_invoke;
      local_c8.func.super__Function_base._M_manager =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:2784:21)>
           ::_M_manager;
      std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::emplace_back<EnqueuedWork>
                (pvVar15,&local_c8);
      if (local_c8.func.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_c8.func.super__Function_base._M_manager)
                  ((_Any_data *)&local_c8.func,(_Any_data *)&local_c8.func,__destroy_functor);
      }
      local_c8.order_index = uVar7 + iVar3 + 6;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
      local_c8.func.super__Function_base._M_functor._8_8_ = 0;
      local_c8.func.super__Function_base._M_functor._M_unused._M_object = operator_new(0x30);
      *(ThreadedReplayer **)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ = local_a0
      ;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 8) = p_Var12;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = p_Var4;
      *(vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>
        **)((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x18) = local_70;
      *(uint *)((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x20) = uVar7;
      *(int *)((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x24) =
           local_8c;
      *(uint *)((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x28) =
           start_index;
      local_c8.func._M_invoker =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:2801:21)>
           ::_M_invoke;
      local_c8.func.super__Function_base._M_manager =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:2801:21)>
           ::_M_manager;
      std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::emplace_back<EnqueuedWork>
                (pvVar15,&local_c8);
      if (local_c8.func.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_c8.func.super__Function_base._M_manager)
                  ((_Any_data *)&local_c8.func,(_Any_data *)&local_c8.func,__destroy_functor);
      }
      p_Var1 = local_98;
      local_c8.order_index = uVar7 + iVar3 + 8;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
        if (__libc_single_threaded != '\0') goto LAB_0014341b;
        LOCK();
        local_98->_M_use_count = local_98->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
LAB_0014341b:
        local_98->_M_use_count = local_98->_M_use_count + 1;
      }
      local_c8.func.super__Function_base._M_functor._8_8_ = 0;
      local_c8.func.super__Function_base._M_functor._M_unused._M_object = operator_new(0x38);
      pvVar15 = local_88;
      *(ThreadedReplayer **)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ = local_a0
      ;
      *(unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
        **)((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 8) = local_78;
      *(unordered_map<unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo>_>_>
        **)((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = puVar8;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x18) = p_Var12;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x20) = p_Var4;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x28) = local_60;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x30) = p_Var1;
      local_c8.func._M_invoker =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:2821:21)>
           ::_M_invoke;
      local_c8.func.super__Function_base._M_manager =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:2821:21)>
           ::_M_manager;
      std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::emplace_back<EnqueuedWork>
                (local_88,&local_c8);
      if (local_c8.func.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_c8.func.super__Function_base._M_manager)
                  ((_Any_data *)&local_c8.func,(_Any_data *)&local_c8.func,__destroy_functor);
      }
      p_Var1 = local_98;
      if (uVar7 == 0) {
        local_c8.order_index = iVar3 + 10;
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_98->_M_use_count = local_98->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_98->_M_use_count = local_98->_M_use_count + 1;
        }
        uVar5 = local_40 | local_50;
        local_c8.func.super__Function_base._M_functor._8_8_ = 0;
        local_c8.func.super__Function_base._M_functor._M_unused._M_object = operator_new(0x30);
        pvVar15 = local_88;
        *(ThreadedReplayer **)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ =
             local_a0;
        *(unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          **)((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 8) = local_78;
        *(unordered_map<unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo>_>_>
          **)((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = local_80
        ;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         ((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x18) = local_60;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         ((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x20) = p_Var1;
        *(ulong *)((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x28) =
             uVar5;
        local_c8.func._M_invoker =
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:2831:21)>
             ::_M_invoke;
        local_c8.func.super__Function_base._M_manager =
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:2831:21)>
             ::_M_manager;
        std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::emplace_back<EnqueuedWork>
                  (local_88,&local_c8);
        puVar8 = local_80;
        if (local_c8.func.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_c8.func.super__Function_base._M_manager)
                    ((_Any_data *)&local_c8.func,(_Any_data *)&local_c8.func,__destroy_functor);
          puVar8 = local_80;
        }
      }
      uVar5 = local_58;
      local_c8.order_index = uVar7 + iVar3 + 0xc;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
      local_c8.func.super__Function_base._M_functor._8_8_ = 0;
      local_c8.func.super__Function_base._M_functor._M_unused._M_object = operator_new(0x38);
      *(ThreadedReplayer **)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ = local_a0
      ;
      *(unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
        **)((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 8) = local_78;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = p_Var12;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x18) = p_Var4;
      *(unordered_map<unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo>_>_>
        **)((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x20) = puVar8;
      *(uint *)((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x28) = uVar7;
      *(int *)((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x2c) =
           local_8c;
      *(uint *)((long)local_c8.func.super__Function_base._M_functor._M_unused._0_8_ + 0x30) =
           start_index;
      local_c8.func._M_invoker =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:2943:21)>
           ::_M_invoke;
      local_c8.func.super__Function_base._M_manager =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:2943:21)>
           ::_M_manager;
      std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::emplace_back<EnqueuedWork>
                (pvVar15,&local_c8);
      if (local_c8.func.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_c8.func.super__Function_base._M_manager)
                  ((_Any_data *)&local_c8.func,(_Any_data *)&local_c8.func,__destroy_functor);
      }
      uVar7 = ~uVar7 & 1;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      uVar9 = (int)uVar5 + 1;
      uVar13 = (ulong)uVar9;
      uVar6 = local_38 & 0xffffffff;
      uVar11 = (long)(local_48->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(local_48->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      uVar5 = (ulong)((int)local_38 + 0x400);
      iVar3 = local_64 + -0x400;
    } while (uVar6 < uVar11);
    iVar3 = (uVar9 >> 1) * 0xe;
    p_Var4 = local_98;
    work = local_88;
  }
  local_c8.order_index = iVar3 + uVar7;
  local_c8.func.super__Function_base._M_functor._M_unused._M_object = local_a0;
  local_c8.func.super__Function_base._M_functor._12_4_ = 0;
  local_c8.func.super__Function_base._M_functor._8_4_ = uVar7;
  local_c8.func._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:3003:20)>
       ::_M_invoke;
  local_c8.func.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:3003:20)>
       ::_M_manager;
  std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::emplace_back<EnqueuedWork>
            (work,&local_c8);
  if (local_c8.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c8.func.super__Function_base._M_manager)
              ((_Any_data *)&local_c8.func,(_Any_data *)&local_c8.func,__destroy_functor);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  return;
}

Assistant:

void enqueue_deferred_pipelines(vector<DerivedInfo> *deferred, const unordered_map<Hash, VkPipeline> &pipelines,
	                                unordered_map<Hash, DerivedInfo> &parents,
	                                vector<EnqueuedWork> &work, const vector<Hash> &hashes, unsigned start_index)
	{
		static const unsigned NUM_PIPELINES_PER_CONTEXT = 1024;

		// Make sure that if we sort by work_index, we get an interleaved execution pattern which
		// will naturally pipeline.
		enum PassOrder
		{
			PARSE_ENQUEUE_OFFSET = 0,
			MAINTAIN_LRU_CACHE = 1,
			ENQUEUE_SHADER_MODULES_PRIMARY_OFFSET = 2,
			RESOLVE_SHADER_MODULE_AND_ENQUEUE_PIPELINES_PRIMARY_OFFSET = 3,
			ENQUEUE_OUT_OF_RANGE_PARENT_PIPELINES = 4,
			ENQUEUE_SHADER_MODULE_SECONDARY_OFFSET = 5,
			ENQUEUE_DERIVED_PIPELINES_OFFSET = 6,
			PASS_COUNT = 7
		};

		unsigned memory_index = 0;
		unsigned iteration = 0;

		// This makes sure that we interleave execution of N iterations. Essentially, we get an execution order:
		// - Pass 0, chunk 0 (context 0)
		// - Pass 0, chunk 1 (context 1)
		// - Pass 1, chunk 0 (context 0)
		// - Pass 1, chunk 1 (context 1)
		// - ...
		// - Pass 6, chunk 0 (reclaim memory for context 0)
		// - Pass 6, chunk 1 (reclaim memory for context 1)
		// - Pass 7, sync point
		// - Pass 0, chunk 2 (context 0)
		// - Pass 1, chunk 3 (context 1)

		const auto get_order_index = [&](unsigned pass) -> unsigned {
			return (iteration / NUM_PIPELINE_MEMORY_CONTEXTS) * PASS_COUNT * NUM_PIPELINE_MEMORY_CONTEXTS +
			       pass * NUM_PIPELINE_MEMORY_CONTEXTS +
			       memory_index;
		};

		auto parsed_parents = make_shared<unordered_set<Hash>>();

		for (unsigned hash_offset = 0; hash_offset < hashes.size(); hash_offset += NUM_PIPELINES_PER_CONTEXT, iteration++)
		{
			unsigned left_to_submit = hashes.size() - hash_offset;
			unsigned to_submit = left_to_submit < NUM_PIPELINES_PER_CONTEXT ? left_to_submit : NUM_PIPELINES_PER_CONTEXT;

			// State which is used between pipeline stages.
			auto derived = make_shared<vector<DerivedInfo>>();

			// Submit pipelines to be parsed.
			work.push_back({ get_order_index(PARSE_ENQUEUE_OFFSET),
			                 [this, &hashes, deferred, memory_index, to_submit, hash_offset]() {
				                 // Drain old allocators.
				                 sync_worker_memory_context(memory_index);
				                 // Reset per memory-context allocators.
				                 for (auto &data : per_thread_data)
				                 {
					                 if (data.per_thread_replayers)
					                 {
						                 data.per_thread_replayers[memory_index].get_allocator().reset();
						                 // We might have to replay the same pipeline multiple times,
						                 // forget handle references.
						                 data.per_thread_replayers[memory_index].forget_pipeline_handle_references();
					                 }
				                 }

				                 // Important that memory is cleared here since we yoinked away the memory
				                 // when resetting allocators.
				                 deferred[memory_index].clear();

				                 deferred[memory_index].resize(to_submit);

				                 for (unsigned index = hash_offset; index < hash_offset + to_submit; index++)
				                 {
					                 auto tag = DerivedInfo::get_tag();
					                 if (cached_blobs[tag].count(hashes[index]) != 0)
					                 {
						                 // Do not do anything with this pipeline.
						                 // Need to check here which is not optimal, since we need to maintain a stable pipeline index
						                 // for the robust replayer mechanism.
						                 // TODO: Consider pre-parsing various databases and emit a SHM block for child replayer processes.
						                 if (opts.control_block)
						                 {
							                 if (tag == RESOURCE_GRAPHICS_PIPELINE)
							                 {
								                 opts.control_block->total_graphics.fetch_add(1, std::memory_order_relaxed);
								                 opts.control_block->cached_graphics.fetch_add(1, std::memory_order_relaxed);
							                 }
							                 else if (tag == RESOURCE_COMPUTE_PIPELINE)
							                 {
								                 opts.control_block->total_compute.fetch_add(1, std::memory_order_relaxed);
								                 opts.control_block->cached_compute.fetch_add(1, std::memory_order_relaxed);
							                 }
							                 else if (tag == RESOURCE_RAYTRACING_PIPELINE)
							                 {
								                 opts.control_block->total_raytracing.fetch_add(1, std::memory_order_relaxed);
								                 opts.control_block->cached_raytracing.fetch_add(1, std::memory_order_relaxed);
							                 }
						                 }
					                 }
					                 else
					                 {
						                 // We are going to free all existing parent pipelines, so we cannot reuse
						                 // any pipeline that was already compiled.
						                 PipelineWorkItem work_item;
						                 work_item.hash = hashes[index];
						                 work_item.tag = DerivedInfo::get_tag();
						                 work_item.parse_only = true;
						                 work_item.memory_context_index = memory_index;
						                 work_item.index = index - hash_offset;

						                 if (opts.control_block)
						                 {
							                 if (tag == RESOURCE_GRAPHICS_PIPELINE)
								                 opts.control_block->total_graphics.fetch_add(1, std::memory_order_relaxed);
							                 else if (tag == RESOURCE_COMPUTE_PIPELINE)
								                 opts.control_block->total_compute.fetch_add(1, std::memory_order_relaxed);
							                 else if (tag == RESOURCE_RAYTRACING_PIPELINE)
								                 opts.control_block->total_raytracing.fetch_add(1, std::memory_order_relaxed);
						                 }

						                 enqueue_work_item(work_item);
					                 }
				                 }
			                 }});

			if (memory_index == 0)
			{
				work.push_back({ get_order_index(MAINTAIN_LRU_CACHE),
				                 [this, &parents]() {
					                 // Now all worker threads are drained for any work which needs shader modules,
					                 // so we can maintain the shader module LRU cache while we're parsing new pipelines in parallel.
					                 shader_modules.prune_cache([this](Hash hash, VkShaderModule module) {
						                 assert(enqueued_shader_modules.count((VkShaderModule) hash) != 0);
						                 //LOGI("Removing shader module %016llx.\n", static_cast<unsigned long long>(hash));
						                 enqueued_shader_modules.erase((VkShaderModule) hash);
						                 if (module != VK_NULL_HANDLE)
						                 {
							                 device->get_feature_filter().unregister_shader_module_info(module);
							                 vkDestroyShaderModule(device->get_device(), module, nullptr);
						                 }

						                 shader_module_evicted_count.fetch_add(1, std::memory_order_relaxed);
					                 });

					                 // Need to forget that we have seen an object before so we can replay the same object multiple times.
					                 for (auto &per_thread : per_thread_data)
						                 if (per_thread.per_thread_replayers)
							                 per_thread.per_thread_replayers[SHADER_MODULE_MEMORY_CONTEXT].forget_handle_references();

									 // We also know that pipelines are not being compiled,
									 // so we can free pipelines.
									 // When using graphics pipeline libraries, most pipelines
									 // will be "parent" pipelines, which leads to excessive memory bloat
									 // if we keep them around indefinitely.
					                 free_pipelines();

					                 parents.clear();

					                 // We might have to replay the same pipeline multiple times,
					                 // forget handle references.
					                 for (auto &per_thread : per_thread_data)
						                 if (per_thread.per_thread_replayers)
							                 per_thread.per_thread_replayers[PARENT_PIPELINE_MEMORY_CONTEXT].forget_pipeline_handle_references();
				                 }});
			}

			work.push_back({ get_order_index(ENQUEUE_SHADER_MODULES_PRIMARY_OFFSET),
			                 [this, derived, deferred, memory_index]() {
				                 // Make sure all parsing of pipelines is complete for this memory context.
				                 sync_worker_memory_context(memory_index);

				                 // Enqueue creation of all shader modules which are referenced by the pipelines.
				                 for (auto &item : deferred[memory_index])
					                 if (item.info)
						                 enqueue_shader_modules(item.info);

				                 // There are two primary kinds of pipelines, derived and non-derived. We split compilation in two here.
				                 // Non-derived pipelines have no dependencies on other pipelines, so we can go ahead,
				                 // and we force that parent pipeline candidates cannot also be derived, which simplifies a lot of things.
				                 // While decompressing modules, we can sort the pipeline infos here in parallel.
				                 sort_deferred_derived_pipelines(*derived, deferred[memory_index]);
			                 }});

			work.push_back({ get_order_index(RESOLVE_SHADER_MODULE_AND_ENQUEUE_PIPELINES_PRIMARY_OFFSET),
			                 [this, derived, deferred, memory_index, hash_offset, start_index]() {
				                 // Make sure all VkShaderModules have been queued and completed.
				                 // We reserve a special memory context for all shader modules since other memory indices
				                 // might queue up shader module work which we need in our memory index.
				                 // Remap VkShaderModule references from hashes to real handles and enqueue
				                 // all non-derived pipelines for work.
				                 sync_worker_memory_context(SHADER_MODULE_MEMORY_CONTEXT);

				                 for (auto &item : deferred[memory_index])
				                 {
					                 if (item.info)
					                 {
						                 resolve_shader_modules(item.info);
						                 enqueue_pipeline(item.hash, item.info, item.pipeline,
						                                  item.index + hash_offset + start_index, memory_index);
					                 }
				                 }
			                 }});

			work.push_back({ get_order_index(ENQUEUE_OUT_OF_RANGE_PARENT_PIPELINES),
			                 [this, &pipelines, &parents, derived, parsed_parents]() {
				                 // Figure out which of the parent pipelines we need.
				                 for (auto &d : *derived)
					                 enqueue_parent_pipelines(d, pipelines, parents, *parsed_parents);
			                 }});

			if (memory_index == 0)
			{
				// This is a join-like operation. We need to wait for all parent pipelines and all shader modules to have completed.
				work.push_back({get_order_index(ENQUEUE_SHADER_MODULE_SECONDARY_OFFSET),
				                [this, &pipelines, &parents, parsed_parents, hash_offset, start_index]()
				                {
					                unordered_set<Hash> dependencies;
					                while (true)
					                {
						                // Wait until all parent pipelines have been parsed.
						                sync_worker_memory_context(PARENT_PIPELINE_MEMORY_CONTEXT);

						                dependencies.clear();
						                std::swap(*parsed_parents, dependencies);

						                for (auto dependency : dependencies)
						                {
							                // Handle nested libraries.
							                enqueue_parent_pipelines(parents.at(dependency), pipelines, parents, *parsed_parents);
						                }

						                if (parsed_parents->empty())
							                break;
					                }

					                // Queue up all shader modules if somehow the shader modules used by parent pipelines differ from children ...
					                for (auto &parent : parents)
					                {
						                // If we enqueued something here, we have to wait for shader handles to resolve.
						                if (parent.second.info)
							                enqueue_shader_modules(parent.second.info);
					                }

					                if (opts.control_block)
					                {
						                auto tag = DerivedInfo::get_tag();
						                if (tag == RESOURCE_GRAPHICS_PIPELINE)
						                {
							                opts.control_block->total_graphics.fetch_add(parents.size(),
							                                                             std::memory_order_relaxed);
						                }
						                else if (tag == RESOURCE_COMPUTE_PIPELINE)
						                {
							                opts.control_block->total_compute.fetch_add(parents.size(),
							                                                            std::memory_order_relaxed);
						                }
						                else if (tag == RESOURCE_RAYTRACING_PIPELINE)
						                {
							                opts.control_block->total_raytracing.fetch_add(parents.size(),
							                                                               std::memory_order_relaxed);
						                }
					                }

					                sync_worker_memory_context(SHADER_MODULE_MEMORY_CONTEXT);

					                unordered_map<Hash, uint32_t> parents_depth;

					                dependencies.clear();
					                for (const auto &parent : parents)
					                {
						                parents_depth[parent.first] = 0;

						                auto library = work_item_get_library_info(parent.second);
						                if (!library)
							                continue;

						                for (uint32_t i = 0; i < library->libraryCount; i++)
							                dependencies.insert((Hash)library->pLibraries[i]);
					                }

					                // Compute the depth of every pipeline library using a DFS starting at the top level libraries.
					                vector<DerivedInfo> ordered_parents; 
					                for (const auto &parent : parents)
					                {
						                ordered_parents.push_back(parent.second);

						                if (dependencies.count(parent.first) == 0)
							                compute_parents_depth(parents, parents_depth, parent.second, 0);
					                }

					                sort(begin(ordered_parents), end(ordered_parents), [&](const DerivedInfo &a, const DerivedInfo &b) -> bool {
						                return parents_depth.at(a.hash) > parents_depth.at(b.hash);
					                });

					                // We might be pulling in a parent pipeline from another memory context next iteration,
					                // so we need to wait for all normal memory contexts.
					                for (unsigned i = 0; i < NUM_PIPELINE_MEMORY_CONTEXTS; i++)
						                sync_worker_memory_context(i);

					                uint32_t prev_depth = UINT32_MAX;
					                for (auto &parent : ordered_parents)
					                {
						                if (!parent.info)
							                continue;

						                if (!derived_work_item_is_satisfied(parent, pipelines))
							                continue;

						                uint32_t depth = parents_depth.at(parent.hash);
						                if (prev_depth != depth)
						                {
							                prev_depth = depth;
							                sync_worker_memory_context(PARENT_PIPELINE_MEMORY_CONTEXT);
						                }

						                resolve_shader_modules(parent.info);
						                resolve_pipelines(parent, pipelines);
						                enqueue_pipeline(parent.hash, parent.info,
						                                 parent.pipeline,
						                                 parent.index + hash_offset + start_index,
						                                 PARENT_PIPELINE_MEMORY_CONTEXT);
					                }
				                }});
			}

			work.push_back({ get_order_index(ENQUEUE_DERIVED_PIPELINES_OFFSET),
			                 [this, &pipelines, derived, &parents, memory_index, hash_offset, start_index]() {
				                 // Go over all pipelines. If there are no further dependencies to resolve, we can go ahead and queue them up.
				                 // If an entry exists in pipelines, we have queued up that hash earlier, but it might not be done compiling yet.
				                 auto itr = unstable_remove_if(begin(*derived), end(*derived), [&](const DerivedInfo &info) -> bool {
					                 return derived_work_item_is_satisfied(info, pipelines) || parents.count(info.hash) != 0;
				                 });

				                 // Wait for parent pipelines to complete.
				                 // Only needed for first memory index.
				                 if (memory_index == 0)
				                 {
					                 sync_worker_memory_context(PARENT_PIPELINE_MEMORY_CONTEXT);

					                 // Now we have replayed the pipelines, so we can reclaim parent pipeline memory for this iteration.
					                 for (auto &per_thread : per_thread_data)
						                 if (per_thread.per_thread_replayers)
							                 per_thread.per_thread_replayers[PARENT_PIPELINE_MEMORY_CONTEXT].get_allocator().reset();
				                 }

				                 // Now we can enqueue pipeline compilation with correct pipeline handles.
				                 for (auto i = itr; i != end(*derived); ++i)
				                 {
					                 // itr always removes parent pipelines because they were already compiled
					                 // in ENQUEUE_SHADER_MODULE_SECONDARY_OFFSET. This way they do not count
					                 // as skipped, but it also means that we need to skip them here to avoid
					                 // compiling them twice.
					                 if (i->info && parents.count(i->hash) == 0)
					                 {
						                 resolve_shader_modules(i->info);
						                 resolve_pipelines(*i, pipelines);
						                 enqueue_pipeline(i->hash, i->info, i->pipeline,
						                                  i->index + hash_offset + start_index, memory_index);
					                 }
				                 }

				                 // It might be possible that we couldn't resolve some dependencies, log this.
				                 if (itr != begin(*derived))
				                 {
					                 auto skipped_count = unsigned(itr - begin(*derived));
					                 LOGW("%u pipelines were not compiled because parent pipelines do not exist.\n", skipped_count);

					                 if (opts.control_block)
					                 {
						                 auto tag = DerivedInfo::get_tag();
						                 if (tag == RESOURCE_GRAPHICS_PIPELINE)
							                 opts.control_block->skipped_graphics.fetch_add(skipped_count, std::memory_order_relaxed);
						                 else if (tag == RESOURCE_COMPUTE_PIPELINE)
							                 opts.control_block->skipped_compute.fetch_add(skipped_count, std::memory_order_relaxed);
						                 else if (tag == RESOURCE_RAYTRACING_PIPELINE)
							                 opts.control_block->skipped_raytracing.fetch_add(skipped_count, std::memory_order_relaxed);
					                 }
				                 }
			                 }});

			memory_index = (memory_index + 1) % NUM_PIPELINE_MEMORY_CONTEXTS;
		}

		// If the last work happens in memory context 0, we won't sync up memory context 1 properly.
		// Ensure that happens properly.
		work.push_back({ get_order_index(PARSE_ENQUEUE_OFFSET),
		                 [this, memory_index]() { sync_worker_memory_context(memory_index); }});
	}